

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

int Amap_ManMergeCountCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  int iFan1;
  int iVar6;
  int iFan0;
  uint *puVar7;
  uint uVar8;
  uint *puVar9;
  
  if (-1 < pNode->Fan[0]) {
    uVar4 = (uint)pNode->Fan[0] >> 1;
    uVar8 = p->vObjs->nSize;
    if ((int)uVar4 < (int)uVar8) {
      if (pNode->Fan[1] < 0) goto LAB_003c74c9;
      uVar5 = (uint)pNode->Fan[1] >> 1;
      if (uVar5 < uVar8) {
        ppvVar1 = p->vObjs->pArray;
        pvVar2 = ppvVar1[uVar4];
        uVar8 = *(uint *)((long)pvVar2 + 8);
        iVar6 = 1;
        if (0xfff < uVar8) {
          puVar7 = *(uint **)((long)pvVar2 + 0x20);
          pvVar3 = ppvVar1[uVar5];
          uVar4 = *(uint *)((long)pvVar3 + 8);
          uVar5 = 0;
          do {
            if (0xfff < uVar4) {
              puVar9 = *(uint **)((long)pvVar3 + 0x20);
              uVar8 = 0;
              do {
                if ((pNode->Fan[0] < 0) || (pNode->Fan[1] < 0)) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf3,"int Abc_LitIsCompl(int)");
                }
                uVar4 = *puVar7 & 0xffff;
                if (uVar4 == 0) {
                  iFan0 = 0;
                }
                else {
                  iFan0 = ((*puVar7 >> 0x10 ^ pNode->Fan[0]) & 1) + uVar4 * 2;
                }
                uVar4 = *puVar9 & 0xffff;
                iFan1 = ((*puVar9 >> 0x10 ^ pNode->Fan[1]) & 1) + uVar4 * 2;
                if (uVar4 == 0) {
                  iFan1 = 0;
                }
                uVar4 = Amap_LibFindNode(p->pLib,iFan0,iFan1,
                                         (uint)(((undefined1  [88])*pNode & (undefined1  [88])0x7)
                                               == (undefined1  [88])0x5));
                iVar6 = iVar6 - ((int)~uVar4 >> 0x1f);
                uVar8 = uVar8 + 1;
                puVar9 = puVar9 + (ulong)(*puVar9 >> 0x11) + 1;
                uVar4 = *(uint *)((long)pvVar3 + 8);
              } while (uVar8 < uVar4 >> 0xc);
              uVar8 = *(uint *)((long)pvVar2 + 8);
            }
            uVar5 = uVar5 + 1;
            puVar7 = puVar7 + (ulong)(*puVar7 >> 0x11) + 1;
          } while (uVar5 < uVar8 >> 0xc);
        }
        return iVar6;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
LAB_003c74c9:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Amap_ManMergeCountCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int Entry, c0, c1, iCompl0, iCompl1, iFan0, iFan1;
    int Counter = 1;
    Amap_NodeForEachCut( pFanin0, pCut0, c0 )
    Amap_NodeForEachCut( pFanin1, pCut1, c1 )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
        Entry = Amap_LibFindNode( p->pLib, iFan0, iFan1, pNode->Type == AMAP_OBJ_XOR );
        Counter += ( Entry >=0 );
//        if ( Entry >=0 )
//            printf( "Full: %d + %d = %d\n", iFan0, iFan1, Entry );
    }
    return Counter;
}